

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O0

void WebRtcIsac_Time2Spec
               (TransformTables *tables,double *inre1,double *inre2,int16_t *outreQ7,
               int16_t *outimQ7,FFTstr *fftstr_obj)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  double dVar11;
  double local_f78;
  double tmpim [240];
  double tmpre [240];
  double fact;
  double yi;
  double yr;
  double xi;
  double xr;
  double tmp1i;
  double tmp1r;
  int dims [1];
  int k;
  FFTstr *fftstr_obj_local;
  int16_t *outimQ7_local;
  int16_t *outreQ7_local;
  double *inre2_local;
  double *inre1_local;
  TransformTables *tables_local;
  
  tmp1r._0_4_ = 0xf0;
  _dims = fftstr_obj;
  dVar11 = sqrt(240.0);
  for (tmp1r._4_4_ = 0; tmp1r._4_4_ < 0xf0; tmp1r._4_4_ = tmp1r._4_4_ + 1) {
    dVar1 = tables->costab1[tmp1r._4_4_];
    dVar2 = tables->sintab1[tmp1r._4_4_];
    tmpim[(long)tmp1r._4_4_ + 0xef] =
         (inre1[tmp1r._4_4_] * dVar1 + inre2[tmp1r._4_4_] * dVar2) * (0.5 / dVar11);
    tmpim[(long)tmp1r._4_4_ + -1] =
         (inre2[tmp1r._4_4_] * dVar1 + -(inre1[tmp1r._4_4_] * dVar2)) * (0.5 / dVar11);
  }
  WebRtcIsac_Fftns(1,(int *)&tmp1r,tmpim + 0xef,&local_f78,-1,1.0,_dims);
  for (tmp1r._4_4_ = 0; tmp1r._4_4_ < 0x78; tmp1r._4_4_ = tmp1r._4_4_ + 1) {
    dVar11 = tmpim[(long)tmp1r._4_4_ + 0xef];
    dVar1 = tmpim[(long)(0xef - tmp1r._4_4_) + 0xef];
    dVar2 = tmpim[(long)tmp1r._4_4_ + 0xef];
    dVar3 = tmpim[(long)(0xef - tmp1r._4_4_) + 0xef];
    dVar4 = tmpim[(long)tmp1r._4_4_ + -1];
    dVar5 = tmpim[(long)(0xef - tmp1r._4_4_) + -1];
    dVar6 = tmpim[(long)tmp1r._4_4_ + -1];
    dVar7 = tmpim[(long)(0xef - tmp1r._4_4_) + -1];
    dVar8 = tables->costab2[tmp1r._4_4_];
    dVar9 = tables->sintab2[tmp1r._4_4_];
    lVar10 = lrint(((dVar11 + dVar1) * dVar8 + -((dVar4 - dVar5) * dVar9)) * 128.0);
    outreQ7[tmp1r._4_4_] = (int16_t)lVar10;
    lVar10 = lrint(((dVar11 + dVar1) * dVar9 + (dVar4 - dVar5) * dVar8) * 128.0);
    outimQ7[tmp1r._4_4_] = (int16_t)lVar10;
    lVar10 = lrint((-(dVar6 + dVar7) * dVar9 + -((-dVar2 + dVar3) * dVar8)) * 128.0);
    outreQ7[0xef - tmp1r._4_4_] = (int16_t)lVar10;
    lVar10 = lrint((-(dVar6 + dVar7) * dVar8 + (-dVar2 + dVar3) * dVar9) * 128.0);
    outimQ7[0xef - tmp1r._4_4_] = (int16_t)lVar10;
  }
  return;
}

Assistant:

void WebRtcIsac_Time2Spec(const TransformTables* tables,
                          double* inre1,
                          double* inre2,
                          int16_t* outreQ7,
                          int16_t* outimQ7,
                          FFTstr* fftstr_obj) {
  int k;
  int dims[1];
  double tmp1r, tmp1i, xr, xi, yr, yi, fact;
  double tmpre[FRAMESAMPLES_HALF], tmpim[FRAMESAMPLES_HALF];


  dims[0] = FRAMESAMPLES_HALF;


  /* Multiply with complex exponentials and combine into one complex vector */
  fact = 0.5 / sqrt(FRAMESAMPLES_HALF);
  for (k = 0; k < FRAMESAMPLES_HALF; k++) {
    tmp1r = tables->costab1[k];
    tmp1i = tables->sintab1[k];
    tmpre[k] = (inre1[k] * tmp1r + inre2[k] * tmp1i) * fact;
    tmpim[k] = (inre2[k] * tmp1r - inre1[k] * tmp1i) * fact;
  }


  /* Get DFT */
  WebRtcIsac_Fftns(1, dims, tmpre, tmpim, -1, 1.0, fftstr_obj);

  /* Use symmetry to separate into two complex vectors and center frames in time around zero */
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    xr = tmpre[k] + tmpre[FRAMESAMPLES_HALF - 1 - k];
    yi = -tmpre[k] + tmpre[FRAMESAMPLES_HALF - 1 - k];
    xi = tmpim[k] - tmpim[FRAMESAMPLES_HALF - 1 - k];
    yr = tmpim[k] + tmpim[FRAMESAMPLES_HALF - 1 - k];

    tmp1r = tables->costab2[k];
    tmp1i = tables->sintab2[k];
    outreQ7[k] = (int16_t)WebRtcIsac_lrint((xr * tmp1r - xi * tmp1i) * 128.0);
    outimQ7[k] = (int16_t)WebRtcIsac_lrint((xr * tmp1i + xi * tmp1r) * 128.0);
    outreQ7[FRAMESAMPLES_HALF - 1 - k] = (int16_t)WebRtcIsac_lrint((-yr * tmp1i - yi * tmp1r) * 128.0);
    outimQ7[FRAMESAMPLES_HALF - 1 - k] = (int16_t)WebRtcIsac_lrint((-yr * tmp1r + yi * tmp1i) * 128.0);
  }
}